

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample(Triangle *this,ShapeSampleContext *ctx,Point2f u)

{
  Point3f *pPVar1;
  initializer_list<float> v_00;
  initializer_list<pbrt::Point3<float>_> v_01;
  span<const_float> w_00;
  span<const_float> w_01;
  Point2f p_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar8;
  bool bVar9;
  ShapeSample *pSVar10;
  Tuple3<pbrt::Normal3,_float> *this_00;
  float *pfVar11;
  long in_RDX;
  long in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar12;
  type tVar13;
  Float FVar14;
  undefined8 uVar51;
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [64];
  undefined8 uVar52;
  undefined1 extraout_var [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar50 [64];
  Point3f PVar54;
  Vector3<float> VVar55;
  array<float,_3> aVar56;
  Point3<float> PVar57;
  Normal3<float> NVar58;
  Vector3f pError;
  Point3f pAbsSum;
  Normal3f ns;
  Normal3f n;
  Point3f p;
  array<float,_3> b;
  Float triPDF;
  array<float,_4> w;
  Vector3f wi_1 [3];
  Point3f rp;
  Float pdf;
  Vector3f wi;
  optional<pbrt::ShapeSample> ss;
  Float solidAngle;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Vector3<float> *in_stack_fffffffffffff6a8;
  Interaction *in_stack_fffffffffffff6b0;
  optional<pbrt::ShapeSample> *this_01;
  optional<pbrt::ShapeSample> *in_stack_fffffffffffff6b8;
  Point3<float> *c;
  undefined4 in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffff6c8;
  Point3fi *pi;
  undefined4 in_stack_fffffffffffff6d0;
  float in_stack_fffffffffffff6d4;
  undefined4 uVar59;
  array<float,_4> *in_stack_fffffffffffff6e0;
  array<float,_3> *paVar60;
  undefined8 in_stack_fffffffffffff6e8;
  size_t i;
  undefined4 in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f4;
  iterator in_stack_fffffffffffff6f8;
  size_type in_stack_fffffffffffff700;
  float *in_stack_fffffffffffff708;
  size_t in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff718;
  float in_stack_fffffffffffff71c;
  float in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  Tuple2<pbrt::Point2,_float> u_00;
  Point3f *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  Point3fi local_748 [3];
  float local_6f8;
  undefined8 local_6f0;
  float local_6e8;
  undefined8 local_6e0;
  float local_6d8;
  undefined8 local_6c8;
  float local_6c0;
  undefined8 local_6b8;
  float local_6b0;
  undefined8 local_6a8;
  float local_6a0;
  undefined8 local_698;
  float local_690;
  undefined8 local_688;
  float local_680;
  undefined8 local_678;
  float local_670;
  undefined8 local_668;
  float local_660;
  undefined8 local_658;
  float local_650;
  undefined8 local_648;
  float local_640;
  undefined8 local_638;
  float local_630;
  undefined8 local_628;
  float local_620;
  undefined8 local_618;
  float local_610;
  undefined8 local_608;
  float local_600;
  undefined8 local_5f8;
  float local_5f0;
  undefined8 local_5e8;
  float local_5e0;
  undefined8 local_5d8;
  float local_5d0;
  undefined8 local_5c8;
  float local_5c0;
  undefined8 local_5b4;
  float local_5ac;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  float local_590;
  undefined8 local_588;
  float local_580;
  undefined8 local_578;
  float local_570;
  undefined8 local_568;
  float local_560;
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  undefined8 local_538;
  float local_530;
  undefined8 local_528;
  float local_520;
  undefined8 local_518;
  float local_510;
  undefined8 local_508;
  float local_500;
  undefined8 local_4f8;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  Triangle *in_stack_fffffffffffffb18;
  undefined8 local_48c;
  float local_484;
  undefined8 local_480;
  float local_478;
  undefined8 local_470;
  float local_468;
  undefined8 local_460;
  float local_458;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  Float *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  Point3f *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a4;
  float local_39c;
  undefined8 local_398;
  float local_390;
  undefined8 *local_388;
  undefined8 local_380;
  undefined1 local_350 [76];
  float local_304;
  float local_300;
  float local_2fc;
  type local_2f8;
  float local_2f4;
  type local_2f0;
  float local_2ec;
  float local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_21c;
  float local_214;
  undefined8 local_210;
  float local_208;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  Normal3<float> local_1d8;
  float local_1cc;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  Tuple3<pbrt::Vector3,_float> local_168;
  Tuple3<pbrt::Vector3,_float> local_158;
  undefined4 local_14c;
  Tuple3<pbrt::Vector3,_float> local_148;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  Tuple3<pbrt::Vector3,_float> local_f8 [10];
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  Float local_64;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  int *local_30;
  TriangleMesh *local_28;
  long local_20;
  undefined8 local_10;
  undefined1 auVar53 [56];
  undefined1 extraout_var_00 [56];
  
  auVar53 = in_ZMM0._8_56_;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_20 = in_RDX;
  local_28 = GetMesh((Triangle *)0x7e0ac0);
  local_30 = local_28->vertexIndices + *(int *)(in_RSI + 4) * 3;
  local_38 = local_28->p[*local_30].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + *local_30;
  local_40._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_40._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_48 = local_28->p[local_30[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[1];
  local_50._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_50._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_58 = local_28->p[local_30[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[2];
  local_60._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_60._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  PVar54 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff6b0);
  local_78 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = auVar53;
  local_80 = vmovlpd_avx(auVar15._0_16_);
  local_70 = local_80;
  local_68 = local_78;
  local_64 = SolidAngle((Triangle *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                        in_stack_fffffffffffff7a8);
  if ((local_64 < 0.0002) || (6.22 < local_64)) {
    Sample(in_stack_fffffffffffffb18,
           (Point2f *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    FVar14 = *(Float *)(local_20 + 0x30);
    pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x7e0c5c)
    ;
    uVar51 = 0;
    (pSVar10->intr).time = FVar14;
    pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x7e0c89);
    PVar54 = Interaction::p(in_stack_fffffffffffff6b0);
    local_110 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
    uVar52 = 0;
    auVar7._8_8_ = uVar51;
    auVar7._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_118 = vmovlpd_avx(auVar7);
    local_108 = local_118;
    local_100 = local_110;
    PVar54 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff6b0);
    local_130 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
    uVar51 = 0;
    auVar6._8_8_ = uVar52;
    auVar6._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
    local_138 = vmovlpd_avx(auVar6);
    local_128 = local_138;
    local_120 = local_130;
    VVar55 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                        (Point3<float> *)in_stack_fffffffffffff6b8);
    local_148.z = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._8_8_ = uVar51;
    auVar5._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_148._0_8_ = vmovlpd_avx(auVar5);
    local_f8[0]._0_8_ = local_148._0_8_;
    local_f8[0].z = local_148.z;
    fVar12 = LengthSquared<float>((Vector3<float> *)local_f8);
    uVar51 = 0;
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      VVar55 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      local_168.z = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar52 = 0;
      auVar4._8_8_ = uVar51;
      auVar4._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_168._0_8_ = vmovlpd_avx(auVar4);
      local_158._0_8_ = local_168._0_8_;
      local_158.z = local_168.z;
      local_f8[0]._0_8_ = local_168._0_8_;
      local_f8[0].z = local_168.z;
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x7e0ed6);
      VVar55 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff6b0);
      local_180 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar3._8_8_ = uVar52;
      auVar3._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_188 = vmovlpd_avx(auVar3);
      local_178 = local_188;
      local_170 = local_180;
      tVar13 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
      auVar53 = extraout_var;
      PVar54 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff6b0);
      local_1a0 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
      auVar16._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar16._8_56_ = auVar53;
      uVar51 = 0;
      local_1a8 = vmovlpd_avx(auVar16._0_16_);
      local_198 = local_1a8;
      local_190 = local_1a0;
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x7e0fe7);
      PVar54 = Interaction::p(in_stack_fffffffffffff6b0);
      local_1c0 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
      auVar2._8_8_ = uVar51;
      auVar2._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_1c8 = vmovlpd_avx(auVar2);
      local_1b8 = local_1c8;
      local_1b0 = local_1c0;
      fVar12 = DistanceSquared<float>
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                          (Point3<float> *)in_stack_fffffffffffff6c8);
      pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->
                          ((optional<pbrt::ShapeSample> *)0x7e10a0);
      pSVar10->pdf = pSVar10->pdf / (tVar13 / fVar12);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x7e10d6);
      eVar8 = IsInf<float>(0.0);
      if (eVar8) {
        memset(in_RDI,0,0x60);
        pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
      }
      else {
        pstd::optional<pbrt::ShapeSample>::optional
                  ((optional<pbrt::ShapeSample> *)
                   CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                   in_stack_fffffffffffff6b8);
      }
    }
    else {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
    local_14c = 1;
    pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x7e1165);
  }
  else {
    local_1cc = 1.0;
    this_00 = (Tuple3<pbrt::Normal3,_float> *)(local_20 + 0x24);
    auVar53 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    Normal3<float>::Normal3
              ((Normal3<float> *)in_stack_fffffffffffff6b0,
               (float)((ulong)in_stack_fffffffffffff6a8 >> 0x20),SUB84(in_stack_fffffffffffff6a8,0),
               0.0);
    bVar9 = Tuple3<pbrt::Normal3,_float>::operator!=(this_00,&local_1d8);
    if (bVar9) {
      PVar54 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff6b0);
      local_1f0 = PVar54.super_Tuple3<pbrt::Point3,_float>.z;
      auVar17._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar17._8_56_ = auVar53;
      local_1f8 = vmovlpd_avx(auVar17._0_16_);
      u_00 = (Tuple2<pbrt::Point2,_float>)&local_1e8;
      local_1e8 = local_1f8;
      local_1e0 = local_1f0;
      VVar55 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      local_240 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar53;
      local_248 = vmovlpd_avx(auVar18._0_16_);
      local_238 = local_248;
      local_230 = local_240;
      VVar55 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      local_250 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar53;
      local_258 = vmovlpd_avx(auVar19._0_16_);
      local_228 = local_258;
      local_220 = local_250;
      VVar55 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      local_270 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar53;
      local_278 = vmovlpd_avx(auVar20._0_16_);
      local_268 = local_278;
      local_260 = local_270;
      VVar55 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      local_280 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar53;
      local_288 = vmovlpd_avx(auVar21._0_16_);
      local_21c = local_288;
      local_214 = local_280;
      VVar55 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      local_2a0 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar53;
      local_2a8 = vmovlpd_avx(auVar22._0_16_);
      local_298 = local_2a8;
      local_290 = local_2a0;
      VVar55 = Normalize<float>((Vector3<float> *)
                                CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      local_2b0 = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar23._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar23._8_56_ = auVar53;
      local_2b8 = vmovlpd_avx(auVar23._0_16_);
      local_2ec = 0.01;
      local_210 = local_2b8;
      local_208 = local_2b0;
      local_2f0 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff6b0,
                                in_stack_fffffffffffff6a8);
      pfVar11 = std::max<float>(&local_2ec,&local_2f0);
      local_2e8 = *pfVar11;
      local_2f4 = 0.01;
      local_2f8 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff6b0,
                                in_stack_fffffffffffff6a8);
      pfVar11 = std::max<float>(&local_2f4,&local_2f8);
      local_2e4 = *pfVar11;
      local_2fc = 0.01;
      local_300 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff6b0,
                                in_stack_fffffffffffff6a8);
      pfVar11 = std::max<float>(&local_2fc,&local_300);
      local_2e0 = *pfVar11;
      local_304 = 0.01;
      local_350._72_4_ =
           AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
      pfVar11 = std::max<float>(&local_304,(float *)(local_350 + 0x48));
      local_2dc = *pfVar11;
      local_2d8 = &local_2e8;
      local_2d0 = 4;
      v_00._M_len._0_4_ = in_stack_fffffffffffff6f0;
      v_00._M_array = (iterator)in_stack_fffffffffffff6e8;
      v_00._M_len._4_4_ = in_stack_fffffffffffff6f4;
      pstd::array<float,_4>::array(in_stack_fffffffffffff6e0,v_00);
      local_350._56_8_ = local_10;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                 (array<float,_4> *)in_stack_fffffffffffff6b8);
      w_01.ptr._4_4_ = in_stack_fffffffffffff71c;
      w_01.ptr._0_4_ = in_stack_fffffffffffff718;
      w_01.n._0_4_ = in_stack_fffffffffffff720;
      w_01.n._4_4_ = in_stack_fffffffffffff724;
      auVar24._0_8_ = SampleBilinear(u_00,w_01);
      auVar24._8_56_ = extraout_var_00;
      local_350._32_8_ = vmovlpd_avx(auVar24._0_16_);
      local_350._64_8_ = local_350._32_8_;
      local_10 = local_350._32_8_;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                 (array<float,_4> *)in_stack_fffffffffffff6b8);
      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff720;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff71c;
      w_00.n = in_stack_fffffffffffff710;
      w_00.ptr = in_stack_fffffffffffff708;
      FVar14 = BilinearPDF(p_00,w_00);
      local_1cc = FVar14 * local_1cc;
      auVar53 = (undefined1  [56])0x0;
    }
    local_3a8 = local_38;
    local_3b0 = local_40;
    local_39c = local_48;
    local_3a4 = local_50;
    local_390 = local_58;
    local_398 = local_60;
    local_388 = &local_3b0;
    local_380 = 3;
    v_01._M_len = in_stack_fffffffffffff700;
    v_01._M_array = in_stack_fffffffffffff6f8;
    pstd::array<pbrt::Point3<float>,_3>::array
              ((array<pbrt::Point3<float>,_3> *)
               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),v_01);
    PVar54 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff6b0);
    auVar25._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar25._8_56_ = auVar53;
    vmovlpd_avx(auVar25._0_16_);
    aVar56 = SampleSphericalTriangle
                       ((array<pbrt::Point3<float>,_3> *)
                        CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                        in_stack_fffffffffffffc20,
                        (Point2f *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                        in_stack_fffffffffffffc10);
    local_350._8_4_ = aVar56.values[2];
    auVar26._0_8_ = aVar56.values._0_8_;
    auVar26._8_56_ = auVar53;
    local_350._0_8_ = vmovlpd_avx(auVar26._0_16_);
    if (((float)local_350._12_4_ != 0.0) || (NAN((float)local_350._12_4_))) {
      local_1cc = local_1cc * (float)local_350._12_4_;
      paVar60 = (array<float,_3> *)local_350;
      pstd::array<float,_3>::operator[](paVar60,0);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_418 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar27._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar27._8_56_ = auVar53;
      local_420 = vmovlpd_avx(auVar27._0_16_);
      local_410 = local_420;
      local_408 = local_418;
      pstd::array<float,_3>::operator[](paVar60,1);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_438 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar28._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar28._8_56_ = auVar53;
      local_440 = vmovlpd_avx(auVar28._0_16_);
      local_430 = local_440;
      local_428 = local_438;
      PVar57 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      local_448 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar29._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar29._8_56_ = auVar53;
      local_450 = vmovlpd_avx(auVar29._0_16_);
      local_400 = local_450;
      local_3f8 = local_448;
      pstd::array<float,_3>::operator[](paVar60,2);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_468 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar30._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar30._8_56_ = auVar53;
      local_470 = vmovlpd_avx(auVar30._0_16_);
      local_460 = local_470;
      local_458 = local_468;
      PVar57 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      local_478 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar31._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar31._8_56_ = auVar53;
      local_480 = vmovlpd_avx(auVar31._0_16_);
      VVar55 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      auVar32._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar32._8_56_ = auVar53;
      vmovlpd_avx(auVar32._0_16_);
      VVar55 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                          (Point3<float> *)in_stack_fffffffffffff6b8);
      auVar33._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar53;
      vmovlpd_avx(auVar33._0_16_);
      VVar55 = Cross<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                            (Vector3<float> *)in_stack_fffffffffffff6b8);
      auVar34._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar34._8_56_ = auVar53;
      local_4f8 = vmovlpd_avx(auVar34._0_16_);
      Normal3<float>::Normal3<float>
                ((Normal3<float> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
      NVar58 = Normalize<float>((Normal3<float> *)
                                CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
      local_500 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar35._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar35._8_56_ = auVar53;
      local_508 = vmovlpd_avx(auVar35._0_16_);
      local_48c = local_508;
      local_484 = local_500;
      if (local_28->n == (Normal3f *)0x0) {
        if ((local_28->reverseOrientation & 1U) != (local_28->transformSwapsHandedness & 1U)) {
          Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_48c,-1);
        }
      }
      else {
        paVar60 = (array<float,_3> *)local_350;
        pstd::array<float,_3>::operator[](paVar60,0);
        auVar53 = (undefined1  [56])0x0;
        NVar58 = pbrt::operator*(in_stack_fffffffffffff6d4,
                                 (Tuple3<pbrt::Normal3,_float> *)in_stack_fffffffffffff6c8);
        local_540 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar36._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar36._8_56_ = auVar53;
        local_548 = vmovlpd_avx(auVar36._0_16_);
        i = 1;
        local_538 = local_548;
        local_530 = local_540;
        pstd::array<float,_3>::operator[](paVar60,1);
        auVar53 = (undefined1  [56])0x0;
        NVar58 = pbrt::operator*(in_stack_fffffffffffff6d4,
                                 (Tuple3<pbrt::Normal3,_float> *)in_stack_fffffffffffff6c8);
        local_560 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar37._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar37._8_56_ = auVar53;
        local_568 = vmovlpd_avx(auVar37._0_16_);
        local_558 = local_568;
        local_550 = local_560;
        NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                            (Normal3<float> *)in_stack_fffffffffffff6b8);
        local_570 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar38._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar38._8_56_ = auVar53;
        local_578 = vmovlpd_avx(auVar38._0_16_);
        local_528 = local_578;
        local_520 = local_570;
        pstd::array<float,_3>::operator[](paVar60,0);
        pstd::array<float,_3>::operator[](paVar60,i);
        auVar53 = (undefined1  [56])0x0;
        NVar58 = pbrt::operator*(in_stack_fffffffffffff6d4,
                                 (Tuple3<pbrt::Normal3,_float> *)in_stack_fffffffffffff6c8);
        local_590 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar39._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar39._8_56_ = auVar53;
        local_598 = vmovlpd_avx(auVar39._0_16_);
        local_588 = local_598;
        local_580 = local_590;
        NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
                            (Normal3<float> *)in_stack_fffffffffffff6b8);
        local_5a0 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar40._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar40._8_56_ = auVar53;
        local_5a8 = vmovlpd_avx(auVar40._0_16_);
        local_518 = local_5a8;
        local_510 = local_5a0;
        NVar58 = FaceForward<float>((Normal3<float> *)
                                    CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                                    (Normal3<float> *)in_stack_fffffffffffff6c8);
        local_5c0 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar41._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar41._8_56_ = auVar53;
        local_5c8 = vmovlpd_avx(auVar41._0_16_);
        local_5b4 = local_5c8;
        local_5ac = local_5c0;
        local_48c = local_5c8;
        local_484 = local_5c0;
      }
      pSVar10 = (ShapeSample *)0x0;
      this_01 = (optional<pbrt::ShapeSample> *)local_350;
      pstd::array<float,_3>::operator[]((array<float,_3> *)this_01,0);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_610 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar42._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar42._8_56_ = auVar53;
      local_618 = vmovlpd_avx(auVar42._0_16_);
      local_608 = local_618;
      local_600 = local_610;
      PVar57 = Abs<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
      local_620 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar43._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar43._8_56_ = auVar53;
      local_628 = vmovlpd_avx(auVar43._0_16_);
      c = (Point3<float> *)0x1;
      local_5f8 = local_628;
      local_5f0 = local_620;
      pstd::array<float,_3>::operator[]((array<float,_3> *)this_01,1);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_650 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar44._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar44._8_56_ = auVar53;
      local_658 = vmovlpd_avx(auVar44._0_16_);
      local_648 = local_658;
      local_640 = local_650;
      PVar57 = Abs<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
      local_660 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar45._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar45._8_56_ = auVar53;
      local_668 = vmovlpd_avx(auVar45._0_16_);
      local_638 = local_668;
      local_630 = local_660;
      PVar57 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),c);
      local_670 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar46._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar46._8_56_ = auVar53;
      local_678 = vmovlpd_avx(auVar46._0_16_);
      local_5e8 = local_678;
      local_5e0 = local_670;
      pfVar11 = pstd::array<float,_3>::operator[]((array<float,_3> *)this_01,(size_t)pSVar10);
      fVar12 = 1.0 - *pfVar11;
      pstd::array<float,_3>::operator[]((array<float,_3> *)this_01,(size_t)c);
      auVar53 = (undefined1  [56])0x0;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_6a0 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar47._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar47._8_56_ = auVar53;
      local_6a8 = vmovlpd_avx(auVar47._0_16_);
      local_698 = local_6a8;
      local_690 = local_6a0;
      PVar57 = Abs<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)CONCAT44(fVar12,in_stack_fffffffffffff6c0))
      ;
      local_6b0 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar48._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar48._8_56_ = auVar53;
      local_6b8 = vmovlpd_avx(auVar48._0_16_);
      local_688 = local_6b8;
      local_680 = local_6b0;
      PVar57 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)CONCAT44(fVar12,in_stack_fffffffffffff6c0),
                          c);
      FVar14 = (Float)((ulong)c >> 0x20);
      local_6c0 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar49._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar49._8_56_ = auVar53;
      local_6c8 = vmovlpd_avx(auVar49._0_16_);
      local_5d8 = local_6c8;
      local_5d0 = local_6c0;
      pbrt::gamma(auVar49._0_8_);
      auVar53 = extraout_var_01;
      PVar57 = pbrt::operator*(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      local_6e8 = PVar57.super_Tuple3<pbrt::Point3,_float>.z;
      auVar50._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar50._8_56_ = auVar53;
      local_6f0 = vmovlpd_avx(auVar50._0_16_);
      local_6e0 = local_6f0;
      local_6d8 = local_6e8;
      Vector3<float>::Vector3<float>((Vector3<float> *)this_01,(Point3<float> *)pSVar10);
      pi = local_748;
      Point3fi::Point3fi((Point3fi *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                         (Point3f *)pi,(Vector3f *)CONCAT44(fVar12,in_stack_fffffffffffff6c0));
      uVar59 = *(undefined4 *)(local_20 + 0x30);
      Point2<float>::Point2((Point2<float> *)this_01);
      Interaction::Interaction
                ((Interaction *)CONCAT44(uVar59,in_stack_fffffffffffff6d0),pi,
                 (Normal3f *)CONCAT44(fVar12,in_stack_fffffffffffff6c0),FVar14,(Point2f *)this_01);
      local_6f8 = local_1cc;
      pstd::optional<pbrt::ShapeSample>::optional(this_01,pSVar10);
    }
    else {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf *= BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }